

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_filesystem.cpp
# Opt level: O0

void __thiscall Omega_h::filesystem::IteratorImpl::increment(IteratorImpl *this)

{
  int iVar1;
  int *piVar2;
  dirent *pdVar3;
  filesystem_error *this_00;
  int in_ESI;
  IteratorImpl *this_local;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  pdVar3 = readdir((DIR *)this->stream);
  this->entry = (dirent *)pdVar3;
  if (this->entry == (dirent *)0x0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0) {
      this_00 = (filesystem_error *)__cxa_allocate_exception(0x20);
      piVar2 = __errno_location();
      filesystem_error::filesystem_error(this_00,*piVar2,"directory_iterator");
      __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    close(this,in_ESI);
  }
  else {
    iVar1 = strcmp(this->entry->d_name,".");
    if (iVar1 == 0) {
      increment(this);
    }
    else {
      iVar1 = strcmp(this->entry->d_name,"..");
      if (iVar1 == 0) {
        increment(this);
      }
    }
  }
  return;
}

Assistant:

void increment() {
    errno = 0;
    entry = ::readdir(stream);
    if (entry == nullptr) {
      if (errno != 0) {
        throw filesystem_error(errno, "directory_iterator");
      }
      // safely reached the end of the directory
      close();
    } else {
      // we just extracted a good entry from the stream
      // skip dot and dot-dot, max 3-call recursion
      if (0 == strcmp(entry->d_name, "."))
        increment();
      else if (0 == strcmp(entry->d_name, ".."))
        increment();
    }
  }